

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L3_dct3_9(float *y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float t4;
  float t2;
  float t0;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  float *y_local;
  
  fVar11 = y[2];
  fVar7 = y[4];
  fVar1 = y[8];
  fVar2 = y[6] * 0.5 + *y;
  fVar3 = *y - y[6];
  fVar4 = (fVar7 + fVar11) * 0.9396926;
  fVar5 = (fVar1 + fVar11) * 0.76604444;
  fVar6 = (fVar7 - fVar1) * 0.17364818;
  fVar7 = (fVar1 - fVar11) + fVar7;
  fVar8 = -fVar7 * 0.5 + fVar3;
  y[4] = fVar7 + fVar3;
  fVar3 = (fVar2 - fVar5) + fVar6;
  fVar5 = (fVar2 - fVar4) + fVar5;
  fVar6 = (fVar2 + fVar4) - fVar6;
  fVar11 = y[1];
  fVar7 = y[5];
  fVar1 = y[7];
  fVar2 = y[3] * 0.8660254;
  fVar9 = (fVar7 + fVar11) * 0.9848077;
  fVar4 = (fVar7 - fVar1) * 0.34202015;
  fVar10 = (fVar11 + fVar1) * 0.64278764;
  fVar11 = ((fVar11 - fVar7) - fVar1) * 0.8660254;
  fVar7 = (fVar9 - fVar2) - fVar10;
  fVar9 = (fVar4 - fVar2) - fVar9;
  fVar10 = (fVar4 + fVar2) - fVar10;
  *y = fVar6 - fVar9;
  y[1] = fVar8 + fVar11;
  y[2] = fVar5 - fVar10;
  y[3] = fVar3 + fVar7;
  y[5] = fVar3 - fVar7;
  y[6] = fVar5 + fVar10;
  y[7] = fVar8 - fVar11;
  y[8] = fVar6 + fVar9;
  return;
}

Assistant:

static void L3_dct3_9(float *y)
{
    float s0, s1, s2, s3, s4, s5, s6, s7, s8, t0, t2, t4;

    s0 = y[0]; s2 = y[2]; s4 = y[4]; s6 = y[6]; s8 = y[8];
    t0 = s0 + s6*0.5f;
    s0 -= s6;
    t4 = (s4 + s2)*0.93969262f;
    t2 = (s8 + s2)*0.76604444f;
    s6 = (s4 - s8)*0.17364818f;
    s4 += s8 - s2;

    s2 = s0 - s4*0.5f;
    y[4] = s4 + s0;
    s8 = t0 - t2 + s6;
    s0 = t0 - t4 + t2;
    s4 = t0 + t4 - s6;

    s1 = y[1]; s3 = y[3]; s5 = y[5]; s7 = y[7];

    s3 *= 0.86602540f;
    t0 = (s5 + s1)*0.98480775f;
    t4 = (s5 - s7)*0.34202014f;
    t2 = (s1 + s7)*0.64278761f;
    s1 = (s1 - s5 - s7)*0.86602540f;

    s5 = t0 - s3 - t2;
    s7 = t4 - s3 - t0;
    s3 = t4 + s3 - t2;

    y[0] = s4 - s7;
    y[1] = s2 + s1;
    y[2] = s0 - s3;
    y[3] = s8 + s5;
    y[5] = s8 - s5;
    y[6] = s0 + s3;
    y[7] = s2 - s1;
    y[8] = s4 + s7;
}